

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int whereLoopAddBtreeIndex
              (WhereLoopBuilder *pBuilder,SrcList_item *pSrc,Index *pProbe,LogEst nInMul)

{
  byte *pbVar1;
  ushort uVar2;
  u16 uVar3;
  u16 uVar4;
  ushort uVar5;
  ushort uVar6;
  LogEst LVar7;
  uint uVar8;
  Parse *pParse;
  sqlite3 *db;
  WhereLoop *p;
  ulong uVar9;
  Expr *pEVar10;
  u32 opMask;
  short nInMul_00;
  LogEst LVar11;
  LogEst LVar12;
  ushort uVar13;
  ushort uVar14;
  short a;
  int iVar15;
  uint uVar16;
  int iVar17;
  WhereTerm *pTerm;
  short sVar18;
  ushort uVar19;
  ulong uVar20;
  u64 x;
  uint uVar21;
  short sVar22;
  u8 uVar23;
  WhereScan scan;
  WhereTerm *local_110;
  uint local_108;
  WhereTerm *local_f0;
  WhereScan local_a0;
  
  pParse = pBuilder->pWInfo->pParse;
  db = pParse->db;
  iVar17 = 7;
  if (db->mallocFailed == '\0') {
    p = pBuilder->pNew;
    uVar8 = p->wsFlags;
    uVar21 = 0x18;
    if ((uVar8 & 0x20) == 0) {
      uVar21 = 0x1bf;
    }
    opMask = uVar21 & 0xffffff83;
    if ((pProbe->field_0x63 & 4) == 0) {
      opMask = uVar21;
    }
    uVar2 = (p->u).btree.nEq;
    uVar3 = (p->u).btree.nBtm;
    uVar4 = (p->u).btree.nTop;
    uVar5 = p->nSkip;
    uVar6 = p->nLTerm;
    uVar9 = p->prereq;
    LVar7 = p->nOut;
    pTerm = whereScanInit(&local_a0,pBuilder->pWC,pSrc->iCursor,(uint)uVar2,opMask,pProbe);
    p->rSetup = 0;
    sVar18 = *pProbe->aiRowLogEst;
    iVar17 = 0;
    LVar11 = 0;
    if (10 < (long)sVar18) {
      LVar11 = sqlite3LogEst((long)sVar18);
      LVar11 = LVar11 + -0x21;
    }
    if (pTerm != (WhereTerm *)0x0) {
      local_f0 = (WhereTerm *)0x0;
      local_110 = (WhereTerm *)0x0;
      do {
        uVar13 = pTerm->eOperator;
        if (uVar13 == 0x100) {
          sVar22 = pProbe->aiColumn[uVar2];
          if ((long)sVar22 < 0) {
            uVar23 = sVar22 == -1;
          }
          else {
            uVar23 = pProbe->pTable->aCol[sVar22].notNull;
          }
          iVar17 = 0;
          if (uVar23 == '\0') goto LAB_00248cb4;
        }
        else {
LAB_00248cb4:
          iVar17 = 0;
          if ((((pTerm->prereqRight & p->maskSelf) == 0) &&
              ((uVar13 != 0x10 || ((pTerm->wtFlags & 0x100) == 0)))) &&
             ((((pSrc->fg).jointype & 8) == 0 ||
              (((uVar13 & 0x180) == 0 || ((pTerm->pExpr->flags & 1) != 0)))))) {
            local_108 = (uint)uVar2;
            if ((pProbe->onError == '\0') || (uVar21 = 2, pProbe->nKeyCol - 1 != local_108)) {
              uVar21 = 1;
            }
            pBuilder->bldFlags = pBuilder->bldFlags | uVar21;
            p->wsFlags = uVar8;
            (p->u).btree.nEq = uVar2;
            (p->u).btree.nBtm = uVar3;
            (p->u).btree.nTop = uVar4;
            p->nLTerm = uVar6;
            iVar15 = whereLoopResize(db,p,uVar6 + 1);
            iVar17 = 0;
            if (iVar15 != 0) break;
            uVar19 = p->nLTerm;
            uVar14 = uVar19 + 1;
            p->nLTerm = uVar14;
            p->aLTerm[uVar19] = pTerm;
            p->prereq = ~p->maskSelf & (pTerm->prereqRight | uVar9);
            if ((uVar13 & 1) != 0) {
              pEVar10 = pTerm->pExpr;
              uVar21 = p->wsFlags | 4;
              p->wsFlags = uVar21;
              if ((pEVar10->flags & 0x800) == 0) {
                LVar12 = 0;
                if (((pEVar10->x).pList != (ExprList *)0x0) &&
                   (x = (u64)((pEVar10->x).pList)->nExpr, x != 0)) {
                  LVar12 = sqlite3LogEst(x);
                }
              }
              else {
                LVar12 = 0x2e;
                if (1 < uVar14) {
                  LVar12 = 0x2e;
                  uVar20 = 0;
                  do {
                    if ((p->aLTerm[uVar20] != (WhereTerm *)0x0) &&
                       (p->aLTerm[uVar20]->pExpr == pEVar10)) {
                      LVar12 = 0;
                    }
                    uVar20 = uVar20 + 1;
                  } while (uVar14 - 1 != uVar20);
                }
              }
              goto LAB_00248f21;
            }
            if ((uVar13 & 0x82) == 0) {
              if ((uVar13 >> 8 & 1) != 0) {
                uVar21 = p->wsFlags | 8;
                p->wsFlags = uVar21;
LAB_00248f1f:
                LVar12 = 0;
                goto LAB_00248f21;
              }
              if ((uVar13 & 0x24) != 0) {
                p->wsFlags = p->wsFlags | 0x22;
                iVar15 = whereRangeVectorLen(pParse,pSrc->iCursor,pProbe,local_108,pTerm);
                (p->u).btree.nBtm = (u16)iVar15;
                local_110 = pTerm;
                if ((pTerm->wtFlags & 0x100) == 0) {
                  uVar21 = p->wsFlags;
                  local_f0 = (WhereTerm *)0x0;
                  goto LAB_00248f1f;
                }
                iVar15 = whereLoopResize(db,p,p->nLTerm + 1);
                if (iVar15 == 0) {
                  uVar19 = p->nLTerm;
                  p->nLTerm = uVar19 + 1;
                  p->aLTerm[uVar19] = pTerm + 1;
                  uVar21 = p->wsFlags | 0x10;
                  p->wsFlags = uVar21;
                  (p->u).btree.nTop = 1;
                  LVar12 = 0;
                  local_f0 = pTerm + 1;
                  goto LAB_00248f21;
                }
                break;
              }
              p->wsFlags = p->wsFlags | 0x12;
              iVar17 = whereRangeVectorLen(pParse,pSrc->iCursor,pProbe,(uint)uVar2,pTerm);
              (p->u).btree.nTop = (u16)iVar17;
              uVar21 = p->wsFlags;
              local_f0 = pTerm;
              if ((uVar21 & 0x20) != 0) {
                local_110 = p->aLTerm[(ulong)p->nLTerm - 2];
                LVar12 = 0;
                goto LAB_00248f21;
              }
              if ((uVar21 & 2) != 0) {
                uVar19 = p->nOut;
                LVar12 = 0;
                local_110 = (WhereTerm *)0x0;
                uVar13 = uVar19;
                goto LAB_00248fb8;
              }
              LVar12 = 0;
              local_110 = (WhereTerm *)0x0;
LAB_00248f27:
              uVar16 = (p->u).vtab.idxNum + 1;
              (p->u).btree.nEq = (u16)uVar16;
              if ((pTerm->truthProb < 1) && (-1 < pProbe->aiColumn[uVar2])) {
                uVar16 = (uint)(ushort)((pTerm->truthProb - LVar12) + p->nOut);
              }
              else {
                uVar20 = (ulong)(uVar16 & 0xffff);
                uVar19 = (pProbe->aiRowLogEst[uVar20] - pProbe->aiRowLogEst[uVar20 - 1]) + p->nOut;
                uVar16 = uVar19 + 10;
                if ((uVar13 >> 8 & 1) == 0) {
                  uVar16 = (uint)uVar19;
                }
              }
            }
            else {
              sVar22 = pProbe->aiColumn[uVar2];
              uVar16 = p->wsFlags;
              uVar21 = uVar16 | 1;
              p->wsFlags = uVar21;
              if (sVar22 == -1) {
LAB_00248f00:
                uVar21 = uVar16 | 0x1001;
                p->wsFlags = uVar21;
              }
              else {
                LVar12 = 0;
                if (((nInMul != 0) || (sVar22 < 1)) ||
                   (LVar12 = 0, pProbe->nKeyCol - 1 != local_108)) goto LAB_00248f21;
                if ((pProbe->field_0x63 & 8) != 0) goto LAB_00248f00;
                uVar21 = uVar16 | 0x10001;
                p->wsFlags = uVar21;
              }
              LVar12 = 0;
LAB_00248f21:
              if ((uVar21 & 2) == 0) goto LAB_00248f27;
              uVar19 = p->nOut;
              uVar13 = uVar19;
              if (local_110 != (WhereTerm *)0x0) {
                if (local_110->truthProb < 1) {
                  uVar13 = local_110->truthProb + uVar19;
                }
                else {
                  uVar13 = uVar19 - 0x14;
                }
              }
              pTerm = local_f0;
              if (local_f0 == (WhereTerm *)0x0) {
                pTerm = (WhereTerm *)0x0;
              }
              else {
LAB_00248fb8:
                if (pTerm->truthProb < 1) {
                  uVar13 = pTerm->truthProb + uVar13;
                }
                else {
                  uVar13 = uVar13 - 0x14;
                }
              }
              uVar14 = uVar13;
              if (((local_110 != (WhereTerm *)0x0) && (pTerm != (WhereTerm *)0x0)) &&
                 ((0 < local_110->truthProb && (uVar14 = uVar13 - 0x14, pTerm->truthProb < 1)))) {
                uVar14 = uVar13;
              }
              uVar16 = (-1 - (uint)(pTerm != (WhereTerm *)0x0)) +
                       (uint)(local_110 == (WhereTerm *)0x0) + (int)(short)uVar19;
              uVar13 = 10;
              if (10 < (short)uVar14) {
                uVar13 = uVar14;
              }
              local_f0 = pTerm;
              if ((int)(uint)uVar13 <= (int)uVar16) {
                uVar16 = (uint)uVar13;
              }
            }
            sVar22 = (short)uVar16;
            a = sqlite3LogEstAdd(LVar11,(short)((pProbe->szIdxRow * 0xf) / (int)pSrc->pTab->szTabRow
                                               ) + sVar22 + 1);
            if ((uVar21 & 0x140) == 0) {
              a = sqlite3LogEstAdd(a,sVar22 + 0x10);
            }
            nInMul_00 = LVar12 + nInMul;
            p->rRun = a + nInMul_00;
            p->nOut = sVar22 + nInMul_00;
            whereLoopOutputAdjust(pBuilder->pWC,p,sVar18);
            iVar17 = whereLoopInsert((WhereLoopBuilder *)pBuilder->pWInfo,
                                     (WhereLoop *)pBuilder->pOrSet);
            if ((p->wsFlags & 2) != 0) {
              sVar22 = LVar7;
            }
            p->nOut = sVar22;
            if (((p->wsFlags & 0x10) == 0) && ((p->u).btree.nEq < pProbe->nColumn)) {
              whereLoopAddBtreeIndex(pBuilder,pSrc,pProbe,nInMul_00);
            }
            p->nOut = LVar7;
          }
        }
        pTerm = whereScanNext(&local_a0);
        if ((iVar17 != 0) || (pTerm == (WhereTerm *)0x0)) break;
      } while( true );
    }
    p->prereq = uVar9;
    (p->u).btree.nEq = uVar2;
    (p->u).btree.nBtm = uVar3;
    (p->u).btree.nTop = uVar4;
    p->nSkip = uVar5;
    p->wsFlags = uVar8;
    p->nOut = LVar7;
    p->nLTerm = uVar6;
    if (((uVar2 == uVar5) &&
        (((uVar2 + 1 < (uint)pProbe->nKeyCol && ((pProbe->field_0x63 & 0x40) == 0)) &&
         (0x29 < pProbe->aiRowLogEst[(ulong)uVar2 + 1])))) &&
       (iVar17 = whereLoopResize(db,p,uVar6 + 1), iVar17 == 0)) {
      (p->u).btree.nEq = (p->u).btree.nEq + 1;
      uVar21._0_2_ = p->nLTerm;
      uVar21._2_2_ = p->nSkip;
      p->nLTerm = (undefined2)uVar21 + 1;
      p->nSkip = uVar21._2_2_ + 1;
      p->aLTerm[uVar21 & 0xffff] = (WhereTerm *)0x0;
      pbVar1 = (byte *)((long)&p->wsFlags + 1);
      *pbVar1 = *pbVar1 | 0x80;
      sVar18 = pProbe->aiRowLogEst[uVar2] - pProbe->aiRowLogEst[(ulong)uVar2 + 1];
      p->nOut = p->nOut - sVar18;
      whereLoopAddBtreeIndex(pBuilder,pSrc,pProbe,nInMul + sVar18 + 5);
      p->nOut = LVar7;
      (p->u).btree.nEq = uVar2;
      p->nSkip = uVar2;
      p->wsFlags = uVar8;
      iVar17 = 0;
    }
  }
  return iVar17;
}

Assistant:

static int whereLoopAddBtreeIndex(
  WhereLoopBuilder *pBuilder,     /* The WhereLoop factory */
  struct SrcList_item *pSrc,      /* FROM clause term being analyzed */
  Index *pProbe,                  /* An index on pSrc */
  LogEst nInMul                   /* log(Number of iterations due to IN) */
){
  WhereInfo *pWInfo = pBuilder->pWInfo;  /* WHERE analyse context */
  Parse *pParse = pWInfo->pParse;        /* Parsing context */
  sqlite3 *db = pParse->db;       /* Database connection malloc context */
  WhereLoop *pNew;                /* Template WhereLoop under construction */
  WhereTerm *pTerm;               /* A WhereTerm under consideration */
  int opMask;                     /* Valid operators for constraints */
  WhereScan scan;                 /* Iterator for WHERE terms */
  Bitmask saved_prereq;           /* Original value of pNew->prereq */
  u16 saved_nLTerm;               /* Original value of pNew->nLTerm */
  u16 saved_nEq;                  /* Original value of pNew->u.btree.nEq */
  u16 saved_nBtm;                 /* Original value of pNew->u.btree.nBtm */
  u16 saved_nTop;                 /* Original value of pNew->u.btree.nTop */
  u16 saved_nSkip;                /* Original value of pNew->nSkip */
  u32 saved_wsFlags;              /* Original value of pNew->wsFlags */
  LogEst saved_nOut;              /* Original value of pNew->nOut */
  int rc = SQLITE_OK;             /* Return code */
  LogEst rSize;                   /* Number of rows in the table */
  LogEst rLogSize;                /* Logarithm of table size */
  WhereTerm *pTop = 0, *pBtm = 0; /* Top and bottom range constraints */

  pNew = pBuilder->pNew;
  if( db->mallocFailed ) return SQLITE_NOMEM_BKPT;
  WHERETRACE(0x800, ("BEGIN addBtreeIdx(%s), nEq=%d\n",
                     pProbe->zName, pNew->u.btree.nEq));

  assert( (pNew->wsFlags & WHERE_VIRTUALTABLE)==0 );
  assert( (pNew->wsFlags & WHERE_TOP_LIMIT)==0 );
  if( pNew->wsFlags & WHERE_BTM_LIMIT ){
    opMask = WO_LT|WO_LE;
  }else{
    assert( pNew->u.btree.nBtm==0 );
    opMask = WO_EQ|WO_IN|WO_GT|WO_GE|WO_LT|WO_LE|WO_ISNULL|WO_IS;
  }
  if( pProbe->bUnordered ) opMask &= ~(WO_GT|WO_GE|WO_LT|WO_LE);

  assert( pNew->u.btree.nEq<pProbe->nColumn );

  saved_nEq = pNew->u.btree.nEq;
  saved_nBtm = pNew->u.btree.nBtm;
  saved_nTop = pNew->u.btree.nTop;
  saved_nSkip = pNew->nSkip;
  saved_nLTerm = pNew->nLTerm;
  saved_wsFlags = pNew->wsFlags;
  saved_prereq = pNew->prereq;
  saved_nOut = pNew->nOut;
  pTerm = whereScanInit(&scan, pBuilder->pWC, pSrc->iCursor, saved_nEq,
                        opMask, pProbe);
  pNew->rSetup = 0;
  rSize = pProbe->aiRowLogEst[0];
  rLogSize = estLog(rSize);
  for(; rc==SQLITE_OK && pTerm!=0; pTerm = whereScanNext(&scan)){
    u16 eOp = pTerm->eOperator;   /* Shorthand for pTerm->eOperator */
    LogEst rCostIdx;
    LogEst nOutUnadjusted;        /* nOut before IN() and WHERE adjustments */
    int nIn = 0;
#ifdef SQLITE_ENABLE_STAT3_OR_STAT4
    int nRecValid = pBuilder->nRecValid;
#endif
    if( (eOp==WO_ISNULL || (pTerm->wtFlags&TERM_VNULL)!=0)
     && indexColumnNotNull(pProbe, saved_nEq)
    ){
      continue; /* ignore IS [NOT] NULL constraints on NOT NULL columns */
    }
    if( pTerm->prereqRight & pNew->maskSelf ) continue;

    /* Do not allow the upper bound of a LIKE optimization range constraint
    ** to mix with a lower range bound from some other source */
    if( pTerm->wtFlags & TERM_LIKEOPT && pTerm->eOperator==WO_LT ) continue;

    /* Do not allow IS constraints from the WHERE clause to be used by the
    ** right table of a LEFT JOIN.  Only constraints in the ON clause are
    ** allowed */
    if( (pSrc->fg.jointype & JT_LEFT)!=0
     && !ExprHasProperty(pTerm->pExpr, EP_FromJoin)
     && (eOp & (WO_IS|WO_ISNULL))!=0
    ){
      testcase( eOp & WO_IS );
      testcase( eOp & WO_ISNULL );
      continue;
    }

    if( IsUniqueIndex(pProbe) && saved_nEq==pProbe->nKeyCol-1 ){
      pBuilder->bldFlags |= SQLITE_BLDF_UNIQUE;
    }else{
      pBuilder->bldFlags |= SQLITE_BLDF_INDEXED;
    }
    pNew->wsFlags = saved_wsFlags;
    pNew->u.btree.nEq = saved_nEq;
    pNew->u.btree.nBtm = saved_nBtm;
    pNew->u.btree.nTop = saved_nTop;
    pNew->nLTerm = saved_nLTerm;
    if( whereLoopResize(db, pNew, pNew->nLTerm+1) ) break; /* OOM */
    pNew->aLTerm[pNew->nLTerm++] = pTerm;
    pNew->prereq = (saved_prereq | pTerm->prereqRight) & ~pNew->maskSelf;

    assert( nInMul==0
        || (pNew->wsFlags & WHERE_COLUMN_NULL)!=0 
        || (pNew->wsFlags & WHERE_COLUMN_IN)!=0 
        || (pNew->wsFlags & WHERE_SKIPSCAN)!=0 
    );

    if( eOp & WO_IN ){
      Expr *pExpr = pTerm->pExpr;
      pNew->wsFlags |= WHERE_COLUMN_IN;
      if( ExprHasProperty(pExpr, EP_xIsSelect) ){
        /* "x IN (SELECT ...)":  TUNING: the SELECT returns 25 rows */
        int i;
        nIn = 46;  assert( 46==sqlite3LogEst(25) );

        /* The expression may actually be of the form (x, y) IN (SELECT...).
        ** In this case there is a separate term for each of (x) and (y).
        ** However, the nIn multiplier should only be applied once, not once
        ** for each such term. The following loop checks that pTerm is the
        ** first such term in use, and sets nIn back to 0 if it is not. */
        for(i=0; i<pNew->nLTerm-1; i++){
          if( pNew->aLTerm[i] && pNew->aLTerm[i]->pExpr==pExpr ) nIn = 0;
        }
      }else if( ALWAYS(pExpr->x.pList && pExpr->x.pList->nExpr) ){
        /* "x IN (value, value, ...)" */
        nIn = sqlite3LogEst(pExpr->x.pList->nExpr);
        assert( nIn>0 );  /* RHS always has 2 or more terms...  The parser
                          ** changes "x IN (?)" into "x=?". */
      }
    }else if( eOp & (WO_EQ|WO_IS) ){
      int iCol = pProbe->aiColumn[saved_nEq];
      pNew->wsFlags |= WHERE_COLUMN_EQ;
      assert( saved_nEq==pNew->u.btree.nEq );
      if( iCol==XN_ROWID 
       || (iCol>0 && nInMul==0 && saved_nEq==pProbe->nKeyCol-1)
      ){
        if( iCol>=0 && pProbe->uniqNotNull==0 ){
          pNew->wsFlags |= WHERE_UNQ_WANTED;
        }else{
          pNew->wsFlags |= WHERE_ONEROW;
        }
      }
    }else if( eOp & WO_ISNULL ){
      pNew->wsFlags |= WHERE_COLUMN_NULL;
    }else if( eOp & (WO_GT|WO_GE) ){
      testcase( eOp & WO_GT );
      testcase( eOp & WO_GE );
      pNew->wsFlags |= WHERE_COLUMN_RANGE|WHERE_BTM_LIMIT;
      pNew->u.btree.nBtm = whereRangeVectorLen(
          pParse, pSrc->iCursor, pProbe, saved_nEq, pTerm
      );
      pBtm = pTerm;
      pTop = 0;
      if( pTerm->wtFlags & TERM_LIKEOPT ){
        /* Range contraints that come from the LIKE optimization are
        ** always used in pairs. */
        pTop = &pTerm[1];
        assert( (pTop-(pTerm->pWC->a))<pTerm->pWC->nTerm );
        assert( pTop->wtFlags & TERM_LIKEOPT );
        assert( pTop->eOperator==WO_LT );
        if( whereLoopResize(db, pNew, pNew->nLTerm+1) ) break; /* OOM */
        pNew->aLTerm[pNew->nLTerm++] = pTop;
        pNew->wsFlags |= WHERE_TOP_LIMIT;
        pNew->u.btree.nTop = 1;
      }
    }else{
      assert( eOp & (WO_LT|WO_LE) );
      testcase( eOp & WO_LT );
      testcase( eOp & WO_LE );
      pNew->wsFlags |= WHERE_COLUMN_RANGE|WHERE_TOP_LIMIT;
      pNew->u.btree.nTop = whereRangeVectorLen(
          pParse, pSrc->iCursor, pProbe, saved_nEq, pTerm
      );
      pTop = pTerm;
      pBtm = (pNew->wsFlags & WHERE_BTM_LIMIT)!=0 ?
                     pNew->aLTerm[pNew->nLTerm-2] : 0;
    }

    /* At this point pNew->nOut is set to the number of rows expected to
    ** be visited by the index scan before considering term pTerm, or the
    ** values of nIn and nInMul. In other words, assuming that all 
    ** "x IN(...)" terms are replaced with "x = ?". This block updates
    ** the value of pNew->nOut to account for pTerm (but not nIn/nInMul).  */
    assert( pNew->nOut==saved_nOut );
    if( pNew->wsFlags & WHERE_COLUMN_RANGE ){
      /* Adjust nOut using stat3/stat4 data. Or, if there is no stat3/stat4
      ** data, using some other estimate.  */
      whereRangeScanEst(pParse, pBuilder, pBtm, pTop, pNew);
    }else{
      int nEq = ++pNew->u.btree.nEq;
      assert( eOp & (WO_ISNULL|WO_EQ|WO_IN|WO_IS) );

      assert( pNew->nOut==saved_nOut );
      if( pTerm->truthProb<=0 && pProbe->aiColumn[saved_nEq]>=0 ){
        assert( (eOp & WO_IN) || nIn==0 );
        testcase( eOp & WO_IN );
        pNew->nOut += pTerm->truthProb;
        pNew->nOut -= nIn;
      }else{
#ifdef SQLITE_ENABLE_STAT3_OR_STAT4
        tRowcnt nOut = 0;
        if( nInMul==0 
         && pProbe->nSample 
         && pNew->u.btree.nEq<=pProbe->nSampleCol
         && ((eOp & WO_IN)==0 || !ExprHasProperty(pTerm->pExpr, EP_xIsSelect))
        ){
          Expr *pExpr = pTerm->pExpr;
          if( (eOp & (WO_EQ|WO_ISNULL|WO_IS))!=0 ){
            testcase( eOp & WO_EQ );
            testcase( eOp & WO_IS );
            testcase( eOp & WO_ISNULL );
            rc = whereEqualScanEst(pParse, pBuilder, pExpr->pRight, &nOut);
          }else{
            rc = whereInScanEst(pParse, pBuilder, pExpr->x.pList, &nOut);
          }
          if( rc==SQLITE_NOTFOUND ) rc = SQLITE_OK;
          if( rc!=SQLITE_OK ) break;          /* Jump out of the pTerm loop */
          if( nOut ){
            pNew->nOut = sqlite3LogEst(nOut);
            if( pNew->nOut>saved_nOut ) pNew->nOut = saved_nOut;
            pNew->nOut -= nIn;
          }
        }
        if( nOut==0 )
#endif
        {
          pNew->nOut += (pProbe->aiRowLogEst[nEq] - pProbe->aiRowLogEst[nEq-1]);
          if( eOp & WO_ISNULL ){
            /* TUNING: If there is no likelihood() value, assume that a 
            ** "col IS NULL" expression matches twice as many rows 
            ** as (col=?). */
            pNew->nOut += 10;
          }
        }
      }
    }

    /* Set rCostIdx to the cost of visiting selected rows in index. Add
    ** it to pNew->rRun, which is currently set to the cost of the index
    ** seek only. Then, if this is a non-covering index, add the cost of
    ** visiting the rows in the main table.  */
    rCostIdx = pNew->nOut + 1 + (15*pProbe->szIdxRow)/pSrc->pTab->szTabRow;
    pNew->rRun = sqlite3LogEstAdd(rLogSize, rCostIdx);
    if( (pNew->wsFlags & (WHERE_IDX_ONLY|WHERE_IPK))==0 ){
      pNew->rRun = sqlite3LogEstAdd(pNew->rRun, pNew->nOut + 16);
    }
    ApplyCostMultiplier(pNew->rRun, pProbe->pTable->costMult);

    nOutUnadjusted = pNew->nOut;
    pNew->rRun += nInMul + nIn;
    pNew->nOut += nInMul + nIn;
    whereLoopOutputAdjust(pBuilder->pWC, pNew, rSize);
    rc = whereLoopInsert(pBuilder, pNew);

    if( pNew->wsFlags & WHERE_COLUMN_RANGE ){
      pNew->nOut = saved_nOut;
    }else{
      pNew->nOut = nOutUnadjusted;
    }

    if( (pNew->wsFlags & WHERE_TOP_LIMIT)==0
     && pNew->u.btree.nEq<pProbe->nColumn
    ){
      whereLoopAddBtreeIndex(pBuilder, pSrc, pProbe, nInMul+nIn);
    }
    pNew->nOut = saved_nOut;
#ifdef SQLITE_ENABLE_STAT3_OR_STAT4
    pBuilder->nRecValid = nRecValid;
#endif
  }
  pNew->prereq = saved_prereq;
  pNew->u.btree.nEq = saved_nEq;
  pNew->u.btree.nBtm = saved_nBtm;
  pNew->u.btree.nTop = saved_nTop;
  pNew->nSkip = saved_nSkip;
  pNew->wsFlags = saved_wsFlags;
  pNew->nOut = saved_nOut;
  pNew->nLTerm = saved_nLTerm;

  /* Consider using a skip-scan if there are no WHERE clause constraints
  ** available for the left-most terms of the index, and if the average
  ** number of repeats in the left-most terms is at least 18. 
  **
  ** The magic number 18 is selected on the basis that scanning 17 rows
  ** is almost always quicker than an index seek (even though if the index
  ** contains fewer than 2^17 rows we assume otherwise in other parts of
  ** the code). And, even if it is not, it should not be too much slower. 
  ** On the other hand, the extra seeks could end up being significantly
  ** more expensive.  */
  assert( 42==sqlite3LogEst(18) );
  if( saved_nEq==saved_nSkip
   && saved_nEq+1<pProbe->nKeyCol
   && pProbe->noSkipScan==0
   && pProbe->aiRowLogEst[saved_nEq+1]>=42  /* TUNING: Minimum for skip-scan */
   && (rc = whereLoopResize(db, pNew, pNew->nLTerm+1))==SQLITE_OK
  ){
    LogEst nIter;
    pNew->u.btree.nEq++;
    pNew->nSkip++;
    pNew->aLTerm[pNew->nLTerm++] = 0;
    pNew->wsFlags |= WHERE_SKIPSCAN;
    nIter = pProbe->aiRowLogEst[saved_nEq] - pProbe->aiRowLogEst[saved_nEq+1];
    pNew->nOut -= nIter;
    /* TUNING:  Because uncertainties in the estimates for skip-scan queries,
    ** add a 1.375 fudge factor to make skip-scan slightly less likely. */
    nIter += 5;
    whereLoopAddBtreeIndex(pBuilder, pSrc, pProbe, nIter + nInMul);
    pNew->nOut = saved_nOut;
    pNew->u.btree.nEq = saved_nEq;
    pNew->nSkip = saved_nSkip;
    pNew->wsFlags = saved_wsFlags;
  }

  WHERETRACE(0x800, ("END addBtreeIdx(%s), nEq=%d, rc=%d\n",
                      pProbe->zName, saved_nEq, rc));
  return rc;
}